

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__get_subrs(stbtt__buf cff,stbtt__buf fontdict)

{
  stbtt__buf sVar1;
  uchar *local_68;
  uchar *local_60;
  undefined1 local_58 [8];
  stbtt__buf pdict;
  int local_40;
  stbtt_uint32 private_loc [2];
  stbtt_uint32 subrsoff;
  stbtt__buf fontdict_local;
  stbtt__buf cff_local;
  
  fontdict_local.data = fontdict._8_8_;
  register0x00000010 = fontdict.data;
  fontdict_local._8_8_ = cff.data;
  private_loc[0] = 0;
  memset(&pdict.size,0,8);
  stbtt__dict_get_ints((stbtt__buf *)(private_loc + 1),0x12,2,(stbtt_uint32 *)&pdict.size);
  if ((local_40 == 0) || (pdict.size == 0)) {
    join_0x00000010_0x00000000_ = stbtt__new_buf((void *)0x0,0);
  }
  else {
    sVar1 = stbtt__buf_range((stbtt__buf *)&fontdict_local.cursor,local_40,pdict.size);
    local_68 = sVar1.data;
    local_58 = (undefined1  [8])local_68;
    local_60 = sVar1._8_8_;
    pdict.data = local_60;
    stbtt__dict_get_ints((stbtt__buf *)local_58,0x13,1,private_loc);
    if (private_loc[0] == 0) {
      join_0x00000010_0x00000000_ = stbtt__new_buf((void *)0x0,0);
    }
    else {
      stbtt__buf_seek((stbtt__buf *)&fontdict_local.cursor,local_40 + private_loc[0]);
      join_0x00000010_0x00000000_ = stbtt__cff_get_index((stbtt__buf *)&fontdict_local.cursor);
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static stbtt__buf stbtt__get_subrs(stbtt__buf cff, stbtt__buf fontdict)
{
   stbtt_uint32 subrsoff = 0, private_loc[2] = { 0, 0 };
   stbtt__buf pdict;
   stbtt__dict_get_ints(&fontdict, 18, 2, private_loc);
   if (!private_loc[1] || !private_loc[0]) return stbtt__new_buf(NULL, 0);
   pdict = stbtt__buf_range(&cff, private_loc[1], private_loc[0]);
   stbtt__dict_get_ints(&pdict, 19, 1, &subrsoff);
   if (!subrsoff) return stbtt__new_buf(NULL, 0);
   stbtt__buf_seek(&cff, private_loc[1]+subrsoff);
   return stbtt__cff_get_index(&cff);
}